

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,duckdb::hugeint_t,duckdb::NotEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  value_type vVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  long lVar8;
  const_reference pvVar9;
  idx_t iVar10;
  idx_t iVar11;
  idx_t iVar12;
  idx_t iVar13;
  idx_t iVar14;
  hugeint_t *lhs_data;
  uchar **rhs_locations;
  bool bVar15;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar3 = rhs_row_locations->data;
    pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar9;
      iVar11 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      iVar10 = 0;
      iVar12 = 0;
      do {
        iVar13 = iVar12;
        if (psVar5 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar5[iVar12];
        }
        iVar14 = iVar13;
        if (psVar6 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar6[iVar13];
        }
        lVar8 = *(long *)(pdVar3 + iVar13 * 8);
        if (((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar8 + (col_idx >> 3))) == 0) ||
           ((*(long *)(pdVar1 + iVar14 * 0x10) == *(long *)(lVar8 + vVar4) &&
            (*(long *)(pdVar1 + iVar14 * 0x10 + 8) == *(long *)(lVar8 + 8 + vVar4))))) {
          *no_match_count = iVar11 + 1;
          no_match_sel->sel_vector[iVar11] = (sel_t)iVar13;
          iVar11 = iVar11 + 1;
        }
        else {
          psVar5[iVar10] = (sel_t)iVar13;
          iVar10 = iVar10 + 1;
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
      return iVar10;
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    pdVar3 = (lhs_format->unified).data;
    pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar9;
      iVar11 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      iVar10 = 0;
      iVar12 = 0;
      do {
        iVar13 = iVar12;
        if (psVar5 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar5[iVar12];
        }
        iVar14 = iVar13;
        if (psVar6 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar6[iVar13];
        }
        if (puVar7 == (unsigned_long *)0x0) {
          bVar15 = false;
        }
        else {
          bVar15 = (puVar7[iVar14 >> 6] >> (iVar14 & 0x3f) & 1) == 0;
        }
        if (((bVar15) ||
            (lVar8 = *(long *)(pdVar1 + iVar13 * 8),
            ((uint)*(byte *)(lVar8 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) ||
           ((*(long *)(pdVar3 + iVar14 * 0x10) == *(long *)(lVar8 + vVar4) &&
            (*(long *)(pdVar3 + iVar14 * 0x10 + 8) == *(long *)(lVar8 + 8 + vVar4))))) {
          *no_match_count = iVar11 + 1;
          no_match_sel->sel_vector[iVar11] = (sel_t)iVar13;
          iVar11 = iVar11 + 1;
        }
        else {
          psVar5[iVar10] = (sel_t)iVar13;
          iVar10 = iVar10 + 1;
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
      return iVar10;
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}